

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void srecmult(double *A,double *B,double *C,int m,int n,int p,int sA,int sB,int sC)

{
  double *B_00;
  double *B_01;
  double *C_00;
  double *B_02;
  int cols;
  ulong uVar1;
  double *C_01;
  double *A_00;
  double *A_01;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  int rows;
  ulong uVar6;
  size_t __size;
  int cols_00;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  size_t __size_00;
  ulong uVar11;
  size_t __size_01;
  double *pdVar12;
  long lVar13;
  double dVar14;
  
  if (0xc0 < n + m + p) {
    rows = m / 2;
    cols_00 = n / 2;
    cols = p / 2;
    lVar10 = (long)cols_00;
    pdVar5 = A + lVar10;
    pdVar12 = pdVar5 + rows * sA;
    lVar13 = (long)cols;
    pdVar4 = B + lVar13;
    B_00 = pdVar4 + cols_00 * sB;
    B_01 = C + lVar13;
    C_00 = C + rows * sC;
    B_02 = B_01 + rows * sC;
    __size_01 = (long)rows * 8 * lVar13;
    C_01 = (double *)malloc(__size_01);
    A_00 = (double *)malloc(__size_01);
    A_01 = (double *)malloc(__size_01);
    __size_00 = (long)rows * 8 * lVar10;
    pdVar2 = (double *)malloc(__size_00);
    __size = lVar10 * lVar13 * 8;
    pdVar3 = (double *)malloc(__size);
    madd_stride(A,pdVar12,pdVar2,rows,cols_00,sA,sA,cols_00);
    madd_stride(B,B_00,pdVar3,cols_00,cols,sB,sB,cols);
    srecmult(pdVar2,pdVar3,C_01,rows,cols_00,cols,cols_00,cols,cols);
    free(pdVar2);
    free(pdVar3);
    pdVar2 = (double *)malloc(__size_00);
    madd_stride(A + rows * sA,pdVar12,pdVar2,rows,cols_00,sA,sA,cols_00);
    srecmult(pdVar2,B,C_00,rows,cols_00,cols,cols_00,sB,sC);
    free(pdVar2);
    pdVar2 = (double *)malloc(__size);
    msub_stride(pdVar4,B_00,pdVar2,cols_00,cols,sB,sB,cols);
    srecmult(A,pdVar2,A_00,rows,cols_00,cols,sA,cols,cols);
    free(pdVar2);
    pdVar2 = (double *)malloc(__size);
    msub_stride(B + cols_00 * sB,B,pdVar2,cols_00,cols,sB,sB,cols);
    srecmult(pdVar12,pdVar2,A_01,rows,cols_00,cols,sA,cols,cols);
    free(pdVar2);
    pdVar2 = (double *)malloc(__size_00);
    madd_stride(A,pdVar5,pdVar2,rows,cols_00,sA,sA,cols_00);
    srecmult(pdVar2,B_00,B_01,rows,cols_00,cols,cols_00,sB,sC);
    free(pdVar2);
    pdVar2 = (double *)malloc(__size_00);
    pdVar3 = (double *)malloc(__size);
    msub_stride(A + rows * sA,A,pdVar2,rows,cols_00,sA,sA,cols_00);
    madd_stride(B,pdVar4,pdVar3,cols_00,cols,sB,sB,cols);
    srecmult(pdVar2,pdVar3,B_02,rows,cols_00,cols,cols_00,cols,sC);
    free(pdVar2);
    free(pdVar3);
    pdVar4 = (double *)malloc(__size_00);
    pdVar2 = (double *)malloc(__size);
    msub_stride(pdVar5,pdVar12,pdVar4,rows,cols_00,sA,sA,cols_00);
    madd_stride(B + cols_00 * sB,B_00,pdVar2,cols_00,cols,sB,sB,cols);
    srecmult(pdVar4,pdVar2,C,rows,cols_00,cols,cols_00,cols,sC);
    free(pdVar4);
    free(pdVar2);
    pdVar5 = (double *)malloc(__size_01);
    madd_stride(C_01,C,C,rows,cols,cols,sC,sC);
    msub_stride(A_01,B_01,pdVar5,rows,cols,cols,sC,cols);
    madd_stride(C,pdVar5,C,rows,cols,sC,cols,sC);
    free(pdVar5);
    pdVar5 = (double *)malloc(__size_01);
    madd_stride(C_01,B_02,B_02,rows,cols,cols,sC,sC);
    msub_stride(A_00,C_00,pdVar5,rows,cols,cols,sC,cols);
    madd_stride(B_02,pdVar5,B_02,rows,cols,sC,cols,sC);
    free(pdVar5);
    madd_stride(A_00,B_01,B_01,rows,cols,cols,sC,sC);
    madd_stride(A_01,C_00,C_00,rows,cols,cols,sC,sC);
    free(C_01);
    free(A_00);
    free(A_01);
    return;
  }
  uVar1 = 0;
  uVar7 = (ulong)(uint)n;
  if (n < 1) {
    uVar7 = 0;
  }
  uVar8 = (ulong)(uint)p;
  if (p < 1) {
    uVar8 = 0;
  }
  uVar6 = (ulong)(uint)m;
  if (m < 1) {
    uVar6 = 0;
  }
  for (; uVar1 != uVar6; uVar1 = uVar1 + 1) {
    pdVar5 = B;
    for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
      dVar14 = 0.0;
      pdVar12 = pdVar5;
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        dVar14 = dVar14 + A[uVar9] * *pdVar12;
        pdVar12 = pdVar12 + sB;
      }
      C[uVar1 * (long)sC + uVar11] = dVar14;
      pdVar5 = pdVar5 + 1;
    }
    A = A + sA;
  }
  return;
}

Assistant:

void srecmult(double* A, double* B, double* C,int m,int n, int p,int sA,int sB, int sC) {
	register int i,j,k;
	int u,v,t;
	double sum;
	double *A1,*B1;
	double *a11,*a12,*a21,*a22;
	double *b11,*b12,*b21,*b22;
	double *c11,*c12,*c21,*c22;
	double *m1,*m2,*m3,*m4,*m5,*m6,*m7;
	int sm1,sm2,sm3,sm4,sm5,sm6,sm7;
	int sA1,sB1;
	if (m + n + p <= CUTOFF) {
		for (i = 0; i < m; ++i) {
			for (j = 0; j < p; ++j) {
				v = i * sA;
				u = i * sC;
				t = j + u;
				sum = 0.;
				for (k = 0; k < n;++k) {
					sum += A[k + v] * B[j + k * sB];
				}
				C[t] = sum;
			}
		}

		
	} else {
		m/=2;n/=2;p/=2;
		// A size mXn, C size mXp
		a11 = A;
		a12 = A + n;
		a21 = A + m * sA;
		a22 = A + n + m * sA;
		
		//B size nXp
		
		b11 = B;
		b12 = B + p;
		b21 = B + n * sB;
		b22 = B + p + n * sB;
		
		//C size mXp
		
		c11 = C;
		c12 = C + p;
		c21 = C + m * sC;
		c22 = C + p + m * sC;
		
		// m matrices have dimension m X p each. See http://en.wikipedia.org/wiki/Strassen_algorithm
		
		m1 = (double*) malloc(sizeof(double) *m * p);
		sm1 = p;
		
		m3 = (double*) malloc(sizeof(double) *m * p);
		sm3 = p;
		
		m4 = (double*) malloc(sizeof(double) *m * p);
		sm4 = p;
		
		m2 = c21;
		sm2 = sC;
		
		m5 = c12;
		sm5 = sC;
		
		m6 = c22;
		sm6 = sC;
		
		
		m7 = c11;
		sm7 = sC;
		
		//m1
		
		sA1 = n;
		sB1 = p;
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		B1 = (double*) malloc(sizeof(double) * n * p);
		
		madd_stride(a11,a22,A1,m,n,sA,sA,sA1);
		
		madd_stride(b11,b22,B1,n,p,sB,sB,sB1);
		
		srecmult(A1,B1,m1,m,n,p,sA1,sB1,sm1);
		
		free(A1);
		free(B1);
		
		
		//m2
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		
		madd_stride(a21,a22,A1,m,n,sA,sA,sA1);
				
		srecmult(A1,b11,m2,m,n,p,sA1,sB,sm2);
		
		free(A1);
		
		
		//m3
		
		B1 = (double*) malloc(sizeof(double) * n * p);
		//rmsub_stride(B + p,B + p + n * sC,B1,n,p,m,sC,sC,sC/2);
		msub_stride(b12,b22,B1,n,p,sB,sB,sB1);
		srecmult(a11,B1,m3,m,n,p,sA,sB1,sm3);
		
		free(B1);
		
		//m4
		
		B1 = (double*) malloc(sizeof(double) * n * p);
		//rmsub_stride(B + p,B + p + n * sC,B1,n,p,m,sC,sC,sC/2);
		msub_stride(b21,b11,B1,n,p,sB,sB,sB1);
		srecmult(a22,B1,m4,m,n,p,sA,sB1,sm4);
		
		free(B1);
		
		//m5
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		
		madd_stride(a11,a12,A1,m,n,sA,sA,sA1);
				
		srecmult(A1,b22,m5,m,n,p,sA1,sB,sm5);
		
		free(A1);
		
		
		//m6
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		B1 = (double*) malloc(sizeof(double) * n * p);
		
		msub_stride(a21,a11,A1,m,n,sA,sA,sA1);
		madd_stride(b11,b12,B1,n,p,sB,sB,sB1);
		srecmult(A1,B1,m6,m,n,p,sA1,sB1,sm6);
	
		free(A1);
		free(B1);
		
		//m7
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		B1 = (double*) malloc(sizeof(double) * n * p);
		
		msub_stride(a12,a22,A1,m,n,sA,sA,sA1);
		madd_stride(b21,b22,B1,n,p,sB,sB,sB1);
		srecmult(A1,B1,m7,m,n,p,sA1,sB1,sm7);
	
		free(A1);
		free(B1);
		
		
		// c11
		
		A1 = (double*) malloc(sizeof(double) * m * p);
		sA1 = p;
		madd_stride(m1,m7,m7,m,p,sm1,sm7,sm7);
		msub_stride(m4,m5,A1,m,p,sm4,sm5,sA1);
		madd_stride(m7,A1,m7,m,p,sm7,sA1,sm7);
		
		free(A1);
		
		
		// c22
		
		A1 = (double*) malloc(sizeof(double) * m * p);
		sA1 = p;
		madd_stride(m1,m6,m6,m,p,sm1,sm6,sm6);
		msub_stride(m3,m2,A1,m,p,sm3,sm2,sA1);
		madd_stride(m6,A1,m6,m,p,sm6,sA1,sm6);
		
		free(A1);
		
		//c12 
		
		madd_stride(m3,m5,m5,m,p,sm3,sm5,sm5);
		
		//c21
		
		madd_stride(m4,m2,m2,m,p,sm4,sm2,sm2);
		
		free(m1);
		free(m3);
		free(m4);
	}
}